

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_h_predictor_16x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  __m128i left_col_8p;
  __m128i local_28;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 uVar9;
  
  uVar1 = *(ulong *)left;
  uVar9 = (undefined1)(uVar1 >> 0x38);
  auVar8._8_6_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[0xe] = uVar9;
  auVar8[0xf] = uVar9;
  uVar9 = (undefined1)(uVar1 >> 0x30);
  auVar7._14_2_ = auVar8._14_2_;
  auVar7._8_5_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[0xd] = uVar9;
  auVar6._13_3_ = auVar7._13_3_;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xc] = uVar9;
  uVar9 = (undefined1)(uVar1 >> 0x28);
  auVar5._12_4_ = auVar6._12_4_;
  auVar5._8_3_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xb] = uVar9;
  auVar4._11_5_ = auVar5._11_5_;
  auVar4._8_2_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[10] = uVar9;
  uVar9 = (undefined1)(uVar1 >> 0x20);
  auVar3._10_6_ = auVar4._10_6_;
  auVar3[8] = 0;
  auVar3._0_8_ = uVar1;
  auVar3[9] = uVar9;
  auVar2._9_7_ = auVar3._9_7_;
  auVar2[8] = uVar9;
  auVar2._0_8_ = uVar1;
  uVar9 = (undefined1)(uVar1 >> 0x18);
  local_28[1] = auVar2._8_8_;
  local_28[0]._7_1_ = uVar9;
  local_28[0]._6_1_ = uVar9;
  uVar9 = (undefined1)(uVar1 >> 0x10);
  local_28[0]._5_1_ = uVar9;
  local_28[0]._4_1_ = uVar9;
  uVar9 = (undefined1)(uVar1 >> 8);
  local_28[0]._3_1_ = uVar9;
  local_28[0]._2_1_ = uVar9;
  local_28[0]._0_1_ = (undefined1)uVar1;
  local_28[0]._1_1_ = (undefined1)local_28[0];
  h_prediction_16x8_1(&local_28,dst,stride);
  h_prediction_16x8_2(&local_28,dst + stride * 4,stride);
  return;
}

Assistant:

void aom_h_predictor_16x8_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  (void)above;
  const __m128i left_col = _mm_loadl_epi64((const __m128i *)left);
  const __m128i left_col_8p = _mm_unpacklo_epi8(left_col, left_col);
  h_prediction_16x8_1(&left_col_8p, dst, stride);
  dst += stride << 2;
  h_prediction_16x8_2(&left_col_8p, dst, stride);
}